

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void __thiscall
testing::internal::
UniversalPrinter<std::variant<solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>>
::Visitor::operator()(Visitor *this,MouseLeftButtonDown *u)

{
  ostream *poVar1;
  type_info *type;
  string local_40;
  
  poVar1 = *(ostream **)this;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'",1);
  GetTypeName_abi_cxx11_
            (&local_40,(internal *)&solitaire::events::MouseLeftButtonDown::typeinfo,type);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(index = ",9);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")\' with value ",0xe);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  PrintBytesInObjectTo((uchar *)u,8,*(ostream **)this);
  return;
}

Assistant:

void operator()(const U& u) const {
      *os << "'" << GetTypeName<U>() << "(index = " << index
          << ")' with value ";
      UniversalPrint(u, os);
    }